

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O1

void vkt::api::anon_unknown_0::addResolveImageWholeArrayImageTests(TestCaseGroup *group)

{
  long lVar1;
  TestContext *testCtx;
  ResolveImageToImageTestCase *node;
  pointer __src;
  ulong __n;
  undefined8 *puVar2;
  pointer __dest;
  undefined8 *puVar3;
  VkSampleCountFlagBits sampleFlag;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar4;
  uint uVar5;
  _anonymous_namespace_ *this;
  long lVar6;
  string description;
  string local_170;
  ResolveImageToImageTestCase *local_150;
  TestNode *local_148;
  undefined1 local_140 [80];
  pointer local_f0;
  _Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  *local_e8;
  long local_e0;
  Buffer local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  local_a8;
  uint local_90;
  Data local_88;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  pointer local_58;
  pointer pCStack_50;
  long local_48;
  uint local_40;
  
  local_a8.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.size = 0x2500000001;
  uStack_d0 = 0x4000000040;
  local_c8 = 0x600000001;
  uStack_c0 = 0x2500000001;
  local_b8 = 0x4000000040;
  uStack_b0 = 0x700000005;
  uVar5 = 0;
  local_148 = &group->super_TestNode;
  do {
    local_140._0_8_ = &DAT_00000001;
    local_140._12_4_ = 1;
    local_140._16_4_ = 0;
    local_140._20_4_ = 0;
    local_140._24_4_ = 0;
    local_140._28_4_ = 1;
    local_140._32_4_ = 0;
    local_140._40_8_ = 1;
    local_140._48_8_ = 0;
    local_140._56_8_ = 0x4000000040;
    local_140._64_4_ = 1;
    local_140._8_4_ = uVar5;
    local_140._36_4_ = uVar5;
    std::
    vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
    ::push_back(&local_a8,(value_type *)local_140);
    __src = local_a8.
            super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
            ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = uVar5 + 1;
  } while (uVar5 < (uint)uStack_b0);
  local_f0 = local_a8.
             super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  __n = (long)local_a8.
              super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_a8.
              super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_e8 = (_Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
              *)(((long)__n >> 4) * -0x3333333333333333);
  lVar6 = 0;
  uVar4 = extraout_RDX;
  do {
    uVar5 = *(uint *)((long)&api::(anonymous_namespace)::samples + lVar6);
    api::(anonymous_namespace)::getSampleCountCaseName_abi_cxx11_
              (&local_170,(_anonymous_namespace_ *)(ulong)uVar5,(VkSampleCountFlagBits)uVar4);
    puVar2 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_170,0,(char *)0x0,0xad6d23);
    puVar3 = puVar2 + 2;
    if ((undefined8 *)*puVar2 == puVar3) {
      local_140._16_4_ = (undefined4)*puVar3;
      local_140._20_4_ = (undefined4)((ulong)*puVar3 >> 0x20);
      local_140._24_4_ = (undefined4)puVar2[3];
      local_140._28_4_ = (undefined4)((ulong)puVar2[3] >> 0x20);
      local_140._0_8_ = local_140 + 0x10;
    }
    else {
      local_140._16_4_ = (undefined4)*puVar3;
      local_140._20_4_ = (undefined4)((ulong)*puVar3 >> 0x20);
      local_140._0_8_ = (undefined8 *)*puVar2;
    }
    local_140._8_4_ = (undefined4)puVar2[1];
    local_140._12_4_ = (undefined4)((ulong)puVar2[1] >> 0x20);
    *puVar2 = puVar3;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    local_150 = (ResolveImageToImageTestCase *)operator_new(200);
    testCtx = local_148->m_testCtx;
    this = (_anonymous_namespace_ *)(ulong)uVar5;
    api::(anonymous_namespace)::getSampleCountCaseName_abi_cxx11_(&local_170,this,sampleFlag);
    local_68 = local_b8;
    uStack_60 = uStack_b0;
    local_88._16_8_ = local_c8;
    uStack_70 = uStack_c0;
    local_88.buffer.size = (Buffer)(Buffer)local_d8.size;
    local_88._8_8_ = uStack_d0;
    local_58 = (pointer)0x0;
    pCStack_50 = (pointer)0x0;
    local_48 = 0;
    __dest = std::
             _Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
             ::_M_allocate(local_e8,(size_t)this);
    lVar1 = (long)__dest + __n;
    local_e0 = lVar6;
    local_58 = __dest;
    local_48 = lVar1;
    if (local_f0 != __src) {
      pCStack_50 = __dest;
      memmove(__dest,__src,__n);
    }
    node = local_150;
    pCStack_50 = (pointer)lVar1;
    local_40 = uVar5;
    ResolveImageToImageTestCase::ResolveImageToImageTestCase
              (local_150,testCtx,&local_170,(string *)local_140,(TestParams *)&local_88.buffer,
               COPY_MS_IMAGE_TO_ARRAY_MS_IMAGE);
    tcu::TestNode::addChild(local_148,(TestNode *)node);
    uVar4 = extraout_RDX_00;
    if (__dest != (pointer)0x0) {
      operator_delete(__dest,__n);
      uVar4 = extraout_RDX_01;
    }
    lVar6 = local_e0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      uVar4 = extraout_RDX_02;
    }
    if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
      operator_delete((void *)local_140._0_8_,CONCAT44(local_140._20_4_,local_140._16_4_) + 1);
      uVar4 = extraout_RDX_03;
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x18);
  if (local_a8.
      super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    local_90 = uVar5;
    operator_delete(local_a8.
                    super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void addResolveImageWholeArrayImageTests (tcu::TestCaseGroup* group)
{
	TestParams	params;
	params.src.image.imageType			= VK_IMAGE_TYPE_2D;
	params.src.image.format				= VK_FORMAT_R8G8B8A8_UNORM;
	params.src.image.extent				= defaultExtent;
	params.src.image.operationLayout	= VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL;
	params.dst.image.imageType			= VK_IMAGE_TYPE_2D;
	params.dst.image.format				= VK_FORMAT_R8G8B8A8_UNORM;
	params.dst.image.extent				= defaultExtent;
	params.dst.image.extent.depth		= 5u;
	params.dst.image.operationLayout	= VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;

	for (deUint32 layerNdx=0; layerNdx < params.dst.image.extent.depth; ++layerNdx)
	{
		const VkImageSubresourceLayers	sourceLayer	=
		{
			VK_IMAGE_ASPECT_COLOR_BIT,		// VkImageAspectFlags	aspectMask;
			0u,								// uint32_t				mipLevel;
			layerNdx,						// uint32_t				baseArrayLayer;
			1u								// uint32_t				layerCount;
		};

		const VkImageResolve			testResolve	=
		{
			sourceLayer,		// VkImageSubresourceLayers	srcSubresource;
			{0, 0, 0},			// VkOffset3D				srcOffset;
			sourceLayer,		// VkImageSubresourceLayers	dstSubresource;
			{0, 0, 0},			// VkOffset3D				dstOffset;
			defaultExtent,		// VkExtent3D				extent;
		};

		CopyRegion	imageResolve;
		imageResolve.imageResolve	= testResolve;
		params.regions.push_back(imageResolve);
	}

	for (int samplesIndex = 0; samplesIndex < DE_LENGTH_OF_ARRAY(samples); ++samplesIndex)
	{
		params.samples					= samples[samplesIndex];
		const std::string description	= "With " + getSampleCountCaseName(samples[samplesIndex]);
		group->addChild(new ResolveImageToImageTestCase(group->getTestContext(), getSampleCountCaseName(samples[samplesIndex]), description, params, COPY_MS_IMAGE_TO_ARRAY_MS_IMAGE));
	}
}